

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O0

_Bool csp_rdp_conn_is_active(csp_conn_t *conn)

{
  int iVar1;
  long in_RDI;
  _Bool active;
  uint32_t time_now;
  _Bool local_d;
  
  csp_get_ms();
  local_d = true;
  iVar1 = csp_rdp_time_after(0,0x10e9e6);
  if (iVar1 != 0) {
    if (csp_dbg_rdp_print != '\0') {
      csp_print_func("\x1b[31mRDP %p: Timeout no packets received last %u ms\n\x1b[0m",in_RDI,
                     (ulong)*(uint *)(in_RDI + 0xe0));
    }
    local_d = false;
  }
  if ((*(int *)(in_RDI + 200) == 4) || (*(int *)(in_RDI + 200) == 0)) {
    local_d = false;
  }
  return local_d;
}

Assistant:

bool csp_rdp_conn_is_active(csp_conn_t *conn) {

	uint32_t time_now = csp_get_ms();
	bool active = true;

	if (csp_rdp_time_after(time_now, conn->timestamp + conn->rdp.conn_timeout)) {
		/* The RDP connection has timed out */
		csp_rdp_error("RDP %p: Timeout no packets received last %u ms\n", (void *)conn, conn->rdp.conn_timeout);
		active = false;
	}

	if (conn->rdp.state == RDP_CLOSE_WAIT || conn->rdp.state == RDP_CLOSED) {
		active = false;
	}

	return active;

}